

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAStopTest1(IDAMem IDA_mem,sunrealtype tout,sunrealtype *tret,N_Vector yret,N_Vector ypret,
                int itask)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *in_RSI;
  long in_RDI;
  int in_R8D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  N_Vector unaff_retaddr;
  sunrealtype troundoff;
  int ier;
  int local_4;
  
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (*(int *)(in_RDI + 600) != 0) {
    if (0.0 < (*(double *)(in_RDI + 0x2a8) - *(double *)(in_RDI + 0x260)) *
              *(double *)(in_RDI + 0x290)) {
      IDAProcessError((int)*(undefined8 *)(in_RDI + 0x260),*(int *)(in_RDI + 0x2a8),(int)in_RDI,
                      (char *)0xffffffea,(char *)0x88a,"IDAStopTest1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                      ,
                      "The value tstop = %lg is behind current t = %lg, in the direction of integration."
                     );
      return -0x16;
    }
    dVar2 = *(double *)(in_RDI + 8) * 100.0 *
            (ABS(*(double *)(in_RDI + 0x2a8)) + ABS(*(double *)(in_RDI + 0x290)));
    if (dVar2 < ABS(*(double *)(in_RDI + 0x2a8) - *(double *)(in_RDI + 0x260))) {
      if (0.0 < ((*(double *)(in_RDI + 0x2a8) + *(double *)(in_RDI + 0x290)) -
                *(double *)(in_RDI + 0x260)) * *(double *)(in_RDI + 0x290)) {
        *(double *)(in_RDI + 0x290) =
             (*(double *)(in_RDI + 0x260) - *(double *)(in_RDI + 0x2a8)) *
             (*(double *)(in_RDI + 8) * -4.0 + 1.0);
      }
    }
    else if ((0.0 <= (dVar1 - *(double *)(in_RDI + 0x260)) * *(double *)(in_RDI + 0x290)) ||
            (ABS(dVar1 - *(double *)(in_RDI + 0x260)) <= dVar2)) {
      iVar3 = IDAGetSolution(ypret,(sunrealtype)CONCAT44(itask,ier),(N_Vector)troundoff,
                             unaff_retaddr);
      if (iVar3 != 0) {
        IDAProcessError((int)*(undefined8 *)(in_RDI + 0x260),*(int *)(in_RDI + 0x2a8),(int)in_RDI,
                        (char *)0xffffffea,(char *)0x89c,"IDAStopTest1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                        ,
                        "The value tstop = %lg is behind current t = %lg, in the direction of integration."
                       );
        return -0x16;
      }
      *(double *)(in_RDI + 0x2b0) = *(double *)(in_RDI + 0x260);
      *in_RSI = *(double *)(in_RDI + 0x260);
      *(undefined4 *)(in_RDI + 600) = 0;
      return 1;
    }
  }
  if (in_R8D == 1) {
    if ((dVar1 != *(double *)(in_RDI + 0x2b0)) || (NAN(dVar1) || NAN(*(double *)(in_RDI + 0x2b0))))
    {
      if ((*(double *)(in_RDI + 0x2a8) - dVar1) * *(double *)(in_RDI + 0x290) < 0.0) {
        local_4 = 99;
      }
      else {
        iVar3 = IDAGetSolution(ypret,(sunrealtype)CONCAT44(itask,ier),(N_Vector)troundoff,
                               unaff_retaddr);
        if (iVar3 == 0) {
          *(double *)(in_RDI + 0x2b0) = dVar1;
          *in_RSI = dVar1;
          local_4 = 0;
        }
        else {
          IDAProcessError(in_XMM0_Da,(int)in_RDI,-0x16,(char *)0x8be,"IDAStopTest1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida.c"
                          ,
                          "Trouble interpolating at tout = %lg. tout too far back in direction of integration."
                         );
          local_4 = -0x16;
        }
      }
    }
    else {
      *(double *)(in_RDI + 0x2b0) = dVar1;
      *in_RSI = dVar1;
      local_4 = 0;
    }
  }
  else if (in_R8D == 2) {
    if ((*(double *)(in_RDI + 0x2a8) - *(double *)(in_RDI + 0x2b0)) * *(double *)(in_RDI + 0x290) <=
        0.0) {
      local_4 = 99;
    }
    else {
      IDAGetSolution(ypret,(sunrealtype)CONCAT44(itask,ier),(N_Vector)troundoff,unaff_retaddr);
      *(double *)(in_RDI + 0x2b0) = *(double *)(in_RDI + 0x2a8);
      *in_RSI = *(double *)(in_RDI + 0x2a8);
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

static int IDAStopTest1(IDAMem IDA_mem, sunrealtype tout, sunrealtype* tret,
                        N_Vector yret, N_Vector ypret, int itask)
{
  int ier;
  sunrealtype troundoff;

  if (IDA_mem->ida_tstopset)
  {
    /* Test for tn past tstop */
    if ((IDA_mem->ida_tn - IDA_mem->ida_tstop) * IDA_mem->ida_hh > ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_TSTOP, IDA_mem->ida_tstop, IDA_mem->ida_tn);
      return (IDA_ILL_INPUT);
    }

    troundoff = HUNDRED * IDA_mem->ida_uround *
                (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));

    /* Test for tn at tstop */
    if (SUNRabs(IDA_mem->ida_tn - IDA_mem->ida_tstop) <= troundoff)
    {
      /* Ensure tout >= tstop, otherwise check for tout return below */
      if ((tout - IDA_mem->ida_tstop) * IDA_mem->ida_hh >= ZERO ||
          SUNRabs(tout - IDA_mem->ida_tstop) <= troundoff)
      {
        ier = IDAGetSolution(IDA_mem, IDA_mem->ida_tstop, yret, ypret);
        if (ier != IDA_SUCCESS)
        {
          IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                          MSG_BAD_TSTOP, IDA_mem->ida_tstop, IDA_mem->ida_tn);
          return (IDA_ILL_INPUT);
        }
        *tret = IDA_mem->ida_tretlast = IDA_mem->ida_tstop;
        IDA_mem->ida_tstopset         = SUNFALSE;
        return (IDA_TSTOP_RETURN);
      }
    }
    /* Test for tn approaching tstop */
    else if ((IDA_mem->ida_tn + IDA_mem->ida_hh - IDA_mem->ida_tstop) *
               IDA_mem->ida_hh >
             ZERO)
    {
      IDA_mem->ida_hh = (IDA_mem->ida_tstop - IDA_mem->ida_tn) *
                        (ONE - FOUR * IDA_mem->ida_uround);
    }
  }

  switch (itask)
  {
  case IDA_NORMAL:

    /* Test for tout = tretlast, and for tn past tout. */
    if (tout == IDA_mem->ida_tretlast)
    {
      *tret = IDA_mem->ida_tretlast = tout;
      return (IDA_SUCCESS);
    }
    if ((IDA_mem->ida_tn - tout) * IDA_mem->ida_hh >= ZERO)
    {
      ier = IDAGetSolution(IDA_mem, tout, yret, ypret);
      if (ier != IDA_SUCCESS)
      {
        IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                        MSG_BAD_TOUT, tout);
        return (IDA_ILL_INPUT);
      }
      *tret = IDA_mem->ida_tretlast = tout;
      return (IDA_SUCCESS);
    }

    return (CONTINUE_STEPS);

  case IDA_ONE_STEP:

    /* Test for tn past tretlast. */
    if ((IDA_mem->ida_tn - IDA_mem->ida_tretlast) * IDA_mem->ida_hh > ZERO)
    {
      ier   = IDAGetSolution(IDA_mem, IDA_mem->ida_tn, yret, ypret);
      *tret = IDA_mem->ida_tretlast = IDA_mem->ida_tn;
      return (IDA_SUCCESS);
    }

    return (CONTINUE_STEPS);
  }
  return (IDA_ILL_INPUT); /* This return should never happen. */
}